

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

void __thiscall ON_ModelComponent::ON_ModelComponent(ON_ModelComponent *this,Type component_type)

{
  __int_type_conflict _Var1;
  ON__UINT64 OVar2;
  Type component_type_local;
  ON_ModelComponent *this_local;
  
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b740b8;
  _Var1 = std::__atomic_base<unsigned_long>::operator++
                    (&Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>);
  this->m_runtime_serial_number = _Var1;
  OVar2 = ON_ModelComponentContentVersionNumberOne(this->m_runtime_serial_number);
  this->m_content_version_number = OVar2;
  this->m_model_serial_number = 0;
  this->m_reference_model_serial_number = 0;
  this->m_linked_idef_serial_number = 0;
  this->m_component_type = component_type;
  this->m_locked_status = 0;
  this->m_set_status = 0;
  this->m_component_status = ON_ComponentStatus::NoneSet;
  this->m_reserved2 = 0;
  this->m_component_index = -0x7fffffff;
  this->m_reserved3 = 0;
  (this->m_component_id).Data1 = 0;
  (this->m_component_id).Data2 = 0;
  (this->m_component_id).Data3 = 0;
  (this->m_component_id).Data4[0] = '\0';
  (this->m_component_id).Data4[1] = '\0';
  (this->m_component_id).Data4[2] = '\0';
  (this->m_component_id).Data4[3] = '\0';
  (this->m_component_id).Data4[4] = '\0';
  (this->m_component_id).Data4[5] = '\0';
  (this->m_component_id).Data4[6] = '\0';
  (this->m_component_id).Data4[7] = '\0';
  (this->m_component_parent_id).Data1 = 0;
  (this->m_component_parent_id).Data2 = 0;
  (this->m_component_parent_id).Data3 = 0;
  (this->m_component_parent_id).Data4[0] = '\0';
  (this->m_component_parent_id).Data4[1] = '\0';
  (this->m_component_parent_id).Data4[2] = '\0';
  (this->m_component_parent_id).Data4[3] = '\0';
  (this->m_component_parent_id).Data4[4] = '\0';
  (this->m_component_parent_id).Data4[5] = '\0';
  (this->m_component_parent_id).Data4[6] = '\0';
  (this->m_component_parent_id).Data4[7] = '\0';
  ON_NameHash::ON_NameHash(&this->m_component_name_hash);
  ON_wString::ON_wString(&this->m_component_name);
  if (this->m_component_type != Unset) {
    this->m_locked_status = 2;
    this->m_set_status = 2;
  }
  return;
}

Assistant:

ON_ModelComponent::ON_ModelComponent(
  ON_ModelComponent::Type component_type
  ) ON_NOEXCEPT
  : m_runtime_serial_number(++ON_ModelComponent::Internal_RuntimeSerialNumberGenerator)
  , m_content_version_number(ON_ModelComponentContentVersionNumberOne(m_runtime_serial_number))
  , m_component_type(component_type)
{
  if (ON_ModelComponent::Type::Unset != m_component_type)
  {
    m_locked_status = ON_ModelComponent::Attributes::TypeAttribute;
    m_set_status = ON_ModelComponent::Attributes::TypeAttribute;
  }
}